

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O0

char RegexTree::parse_control(char ch)

{
  undefined1 local_9;
  char ch_local;
  
  if (ch == '(') {
    local_9 = '\x11';
  }
  else if (ch == '*') {
    local_9 = '\t';
  }
  else if (ch == '+') {
    local_9 = '\v';
  }
  else if (ch == '.') {
    local_9 = '\x10';
  }
  else if (ch == '?') {
    local_9 = '\f';
  }
  else {
    local_9 = ch;
    if (ch == '|') {
      local_9 = '\n';
    }
  }
  return local_9;
}

Assistant:

char RegexTree::parse_control(char ch) {
    switch (ch) {
        case '*':
            return STAR;
        case '+':
            return PLUS;
        case '?':
            return QUESTION;
        case '(':
            return BLOCK;
        case '|':
            return OR;
        case '.':
            return WILDCARD;
        default:
            return ch;
    }
}